

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O0

int snprintf_s_si(char *dest,rsize_t dmax,char *format,char *s,int a)

{
  uint uVar1;
  char *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  uint in_R8D;
  uint nfo;
  uint index;
  char pformatList [16];
  undefined1 local_48;
  undefined1 uStackY_47;
  undefined4 local_4;
  
  uVar1 = parse_format(in_RDX,in_RCX,in_R8D);
  if (uVar1 == 2) {
    if (local_48 == 's') {
      uVar1 = check_integer_format(uStackY_47);
      if (uVar1 == 0) {
        *in_RDI = '\0';
        local_4 = -0x19b;
      }
      else {
        local_4 = snprintf(in_RDI,in_RSI,in_RDX,in_RCX,(ulong)in_R8D);
      }
    }
    else {
      *in_RDI = '\0';
      local_4 = -0x19b;
    }
  }
  else {
    *in_RDI = '\0';
    local_4 = -0x19a;
  }
  return local_4;
}

Assistant:

inline int snprintf_s_si(char *dest, rsize_t dmax, const char *format, char *s, int a)
{
	char pformatList[MAX_FORMAT_ELEMENTS];
	unsigned int index = 0;

	// Determine the number of format options in the format string
	unsigned int  nfo = parse_format(format, &pformatList[0], MAX_FORMAT_ELEMENTS);

	// Check that there are not too many format options
	if ( nfo != 2 ) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESBADFMT);
	}
	// Check first format is of string type
	if ( CHK_FORMAT(FMT_STRING, pformatList[index]) == 0) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESFMTTYP);
	}
	index++;

	// Check that the format is for an integer type
	if ( check_integer_format(pformatList[index]) == 0) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESFMTTYP);
	}
	index++;

	return snprintf(dest, dmax, format, s, a);
}